

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O0

GLenum Diligent::TexFormatToGLInternalTexFormat(TEXTURE_FORMAT TexFormat,Uint32 BindFlags)

{
  int iVar1;
  Char *Message;
  char local_50 [4];
  uint local_4c;
  undefined1 local_48 [8];
  string msg;
  GLenum GLFormat;
  Uint32 BindFlags_local;
  TEXTURE_FORMAT TexFormat_local;
  
  if ((TexFormatToGLInternalTexFormat(Diligent::TEXTURE_FORMAT,unsigned_int)::FormatMap == '\0') &&
     (iVar1 = __cxa_guard_acquire(&TexFormatToGLInternalTexFormat(Diligent::TEXTURE_FORMAT,unsigned_int)
                                   ::FormatMap), iVar1 != 0)) {
    anon_unknown_1::FormatToGLInternalTexFormatMap::FormatToGLInternalTexFormatMap
              (&TexFormatToGLInternalTexFormat::FormatMap);
    __cxa_guard_release(&TexFormatToGLInternalTexFormat(Diligent::TEXTURE_FORMAT,unsigned_int)::
                         FormatMap);
  }
  if (TexFormat < TEX_FORMAT_NUM_FORMATS) {
    msg.field_2._8_4_ =
         anon_unknown_1::FormatToGLInternalTexFormatMap::operator[]
                   (&TexFormatToGLInternalTexFormat::FormatMap,TexFormat);
    if (BindFlags != 0) {
      msg.field_2._8_4_ = CorrectGLTexFormat(msg.field_2._8_4_,BindFlags);
    }
    BindFlags_local = msg.field_2._8_4_;
  }
  else {
    local_4c = (uint)TexFormat;
    local_50[0] = 'i';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    FormatString<char[17],int,char[31],int,char[2]>
              ((string *)local_48,(Diligent *)"Texture format (",(char (*) [17])&local_4c,
               (int *)") is out of allowed range [0, ",(char (*) [31])local_50,(int *)0xef0e6a,
               (char (*) [2])local_48);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"TexFormatToGLInternalTexFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
               ,0xcd);
    std::__cxx11::string::~string((string *)local_48);
    BindFlags_local = 0;
  }
  return BindFlags_local;
}

Assistant:

GLenum TexFormatToGLInternalTexFormat(TEXTURE_FORMAT TexFormat, Uint32 BindFlags)
{
    static const FormatToGLInternalTexFormatMap FormatMap;
    if (TexFormat >= TEX_FORMAT_UNKNOWN && TexFormat < TEX_FORMAT_NUM_FORMATS)
    {
        auto GLFormat = FormatMap[TexFormat];
        if (BindFlags != 0)
            GLFormat = CorrectGLTexFormat(GLFormat, BindFlags);
        return GLFormat;
    }
    else
    {
        UNEXPECTED("Texture format (", int{TexFormat}, ") is out of allowed range [0, ", int{TEX_FORMAT_NUM_FORMATS} - 1, "]");
        return 0;
    }
}